

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

KeyID __thiscall
anon_unknown.dwarf_4fe9e4::BuildEngineImpl::getKeyID(BuildEngineImpl *this,KeyType *key)

{
  pointer pcVar1;
  StringRef Key;
  int iVar2;
  ulong uVar3;
  pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> pVar4;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  undefined8 local_40;
  long *local_38;
  size_t local_30;
  KeyID local_28;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->keyTableMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pcVar1 = (key->key)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (key->key)._M_string_length);
  local_40 = 0;
  Key.Length = local_58;
  Key.Data = (char *)local_60;
  local_38 = local_60;
  local_30 = local_58;
  local_28._value = 0;
  pVar4 = llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::
          try_emplace<llbuild::core::KeyID>(&this->keyTable,Key,&local_28);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  uVar3 = *(long *)pVar4.first.
                   super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
                   .Ptr.
                   super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
          + 0x10;
  if (uVar3 < 0xfffffffffffffff0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->keyTableMutex);
    return (KeyID)uVar3;
  }
  __assert_fail("_value < MaxValidID",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Core/KeyID.h"
                ,0x36,"llbuild::core::KeyID::KeyID(const void *)");
}

Assistant:

virtual const KeyID getKeyID(const KeyType& key) override {
    std::lock_guard<std::mutex> guard(keyTableMutex);

    // The RHS of the mapping is actually ignored, we use the StringMap's ptr
    // identity because it allows us to efficiently map back to the key string
    // in `getRuleInfoForKey`.
    auto it = keyTable.insert(std::make_pair(key.str(), KeyID::novalue())).first;
    return KeyID(it->getKey().data());
  }